

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::UninterpretedOption::SerializeWithCachedSizesToArray
          (UninterpretedOption *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  UninterpretedOption_NamePart *this_00;
  uint8 *puVar4;
  uint64 uVar5;
  char *pcVar6;
  string *psVar7;
  UnknownFieldSet *pUVar8;
  double value;
  int local_20c;
  byte *pbStack_208;
  int i;
  uint8 *target_local;
  UninterpretedOption *this_local;
  byte *local_a0;
  byte *local_88;
  byte *local_70;
  byte *local_58;
  byte *local_40;
  byte *local_28;
  byte *local_10;
  
  pbStack_208 = target;
  for (local_20c = 0; iVar2 = name_size(this), local_20c < iVar2; local_20c = local_20c + 1) {
    this_00 = name(this,local_20c);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_208 = (byte)uVar3;
      local_70 = pbStack_208 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_208 = (byte)uVar3 | 0x80;
      pbStack_208[1] = (byte)(uVar3 >> 7);
      local_70 = pbStack_208 + 2;
    }
    else {
      local_70 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_208);
    }
    uVar3 = UninterpretedOption_NamePart::GetCachedSize(this_00);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_70);
    pbStack_208 = UninterpretedOption_NamePart::SerializeWithCachedSizesToArray(this_00,puVar4);
  }
  bVar1 = has_identifier_value(this);
  if (bVar1) {
    identifier_value_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    identifier_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar6,iVar2,SERIALIZE);
    psVar7 = identifier_value_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_208 = (byte)uVar3;
      local_88 = pbStack_208 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_208 = (byte)uVar3 | 0x80;
      pbStack_208[1] = (byte)(uVar3 >> 7);
      local_88 = pbStack_208 + 2;
    }
    else {
      local_88 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_208);
    }
    uVar3 = std::__cxx11::string::size();
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_88);
    pbStack_208 = io::CodedOutputStream::WriteStringToArray(psVar7,puVar4);
  }
  bVar1 = has_positive_int_value(this);
  if (bVar1) {
    uVar5 = positive_int_value(this);
    uVar3 = internal::WireFormatLite::MakeTag(4,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_208 = (byte)uVar3;
      local_58 = pbStack_208 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_208 = (byte)uVar3 | 0x80;
      pbStack_208[1] = (byte)(uVar3 >> 7);
      local_58 = pbStack_208 + 2;
    }
    else {
      local_58 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_208);
    }
    pbStack_208 = io::CodedOutputStream::WriteVarint64ToArray(uVar5,local_58);
  }
  bVar1 = has_negative_int_value(this);
  if (bVar1) {
    uVar5 = negative_int_value(this);
    uVar3 = internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_208 = (byte)uVar3;
      local_40 = pbStack_208 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_208 = (byte)uVar3 | 0x80;
      pbStack_208[1] = (byte)(uVar3 >> 7);
      local_40 = pbStack_208 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_208);
    }
    pbStack_208 = io::CodedOutputStream::WriteVarint64ToArray(uVar5,local_40);
  }
  bVar1 = has_double_value(this);
  if (bVar1) {
    value = double_value(this);
    uVar3 = internal::WireFormatLite::MakeTag(6,WIRETYPE_FIXED64);
    if (uVar3 < 0x80) {
      *pbStack_208 = (byte)uVar3;
      local_28 = pbStack_208 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_208 = (byte)uVar3 | 0x80;
      pbStack_208[1] = (byte)(uVar3 >> 7);
      local_28 = pbStack_208 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_208);
    }
    uVar5 = internal::WireFormatLite::EncodeDouble(value);
    pbStack_208 = io::CodedOutputStream::WriteLittleEndian64ToArray(uVar5,local_28);
  }
  bVar1 = has_string_value(this);
  if (bVar1) {
    psVar7 = string_value_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(7,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_208 = (byte)uVar3;
      local_10 = pbStack_208 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_208 = (byte)uVar3 | 0x80;
      pbStack_208[1] = (byte)(uVar3 >> 7);
      local_10 = pbStack_208 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_208);
    }
    uVar3 = std::__cxx11::string::size();
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    pbStack_208 = io::CodedOutputStream::WriteStringToArray(psVar7,puVar4);
  }
  bVar1 = has_aggregate_value(this);
  if (bVar1) {
    aggregate_value_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    aggregate_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar6,iVar2,SERIALIZE);
    psVar7 = aggregate_value_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(8,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_208 = (byte)uVar3;
      local_a0 = pbStack_208 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_208 = (byte)uVar3 | 0x80;
      pbStack_208[1] = (byte)(uVar3 >> 7);
      local_a0 = pbStack_208 + 2;
    }
    else {
      local_a0 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_208);
    }
    uVar3 = std::__cxx11::string::size();
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_a0);
    pbStack_208 = io::CodedOutputStream::WriteStringToArray(psVar7,puVar4);
  }
  pUVar8 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar8);
  if (!bVar1) {
    pUVar8 = unknown_fields(this);
    pbStack_208 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar8,pbStack_208);
  }
  return pbStack_208;
}

Assistant:

::google::protobuf::uint8* UninterpretedOption::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (int i = 0; i < this->name_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        2, this->name(i), target);
  }

  // optional string identifier_value = 3;
  if (has_identifier_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (has_positive_int_value()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(4, this->positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (has_negative_int_value()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt64ToArray(5, this->negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (has_double_value()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteDoubleToArray(6, this->double_value(), target);
  }

  // optional bytes string_value = 7;
  if (has_string_value()) {
    target =
      ::google::protobuf::internal::WireFormatLite::WriteBytesToArray(
        7, this->string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (has_aggregate_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->aggregate_value(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}